

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::OnAssertUnlinkableCommand
          (CommandRunner *this,AssertUnlinkableCommand *command)

{
  uint32_t line_number;
  pointer pcVar1;
  bool bVar2;
  Ref module_00;
  Enum EVar3;
  string_view module_filename;
  Ptr module;
  Ptr instance;
  Ptr trap;
  RefVec imports;
  Errors errors;
  Ptr local_e8;
  Ptr local_c8;
  Ptr local_a8;
  RefVec local_88;
  long *local_68 [2];
  long local_58 [2];
  Errors local_48;
  
  local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  module_filename._M_str = (command->filename)._M_dataplus._M_p;
  module_filename._M_len = (command->filename)._M_string_length;
  ReadModule(&local_e8,this,module_filename,&local_48);
  if (local_e8.obj_ == (Module *)0x0) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line,
               "unable to compile unlinkable module: \"%s\"",(command->filename)._M_dataplus._M_p);
    EVar3 = Error;
  }
  else {
    EVar3 = Error;
    bVar2 = CheckIR(&command->filename,true);
    if (bVar2) {
      local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PopulateImports(this,&local_e8,&local_88);
      local_a8.root_index_ = 0;
      local_a8.obj_ = (Trap *)0x0;
      local_a8.store_ = (Store *)0x0;
      module_00 = wabt::interp::RefPtr<wabt::interp::Module>::ref(&local_e8);
      wabt::interp::Instance::Instantiate(&local_c8,&this->store_,module_00,&local_88,&local_a8);
      line_number = (command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line;
      if (local_a8.obj_ == (Trap *)0x0) {
        PrintError(this,line_number,"expected module to be unlinkable: \"%s\"",
                   (command->filename)._M_dataplus._M_p);
        EVar3 = Error;
      }
      else {
        pcVar1 = ((local_a8.obj_)->message_)._M_dataplus._M_p;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,pcVar1,pcVar1 + ((local_a8.obj_)->message_)._M_string_length);
        PrintError(this,line_number,"assert_unlinkable passed:\n  error: %s",local_68[0]);
        EVar3 = Ok;
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
          EVar3 = Ok;
        }
      }
      if (local_c8.obj_ != (Instance *)0x0) {
        wabt::interp::Store::DeleteRoot(local_c8.store_,local_c8.root_index_);
        local_c8.obj_ = (Instance *)0x0;
        local_c8.store_ = (Store *)0x0;
        local_c8.root_index_ = 0;
      }
      if (local_a8.obj_ != (Trap *)0x0) {
        wabt::interp::Store::DeleteRoot(local_a8.store_,local_a8.root_index_);
        local_a8.obj_ = (Trap *)0x0;
        local_a8.store_ = (Store *)0x0;
        local_a8.root_index_ = 0;
      }
      if (local_88.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      PrintError(this,(command->super_CommandMixin<(wabt::CommandType)6>).super_Command.line,
                 "IR Validator thinks module is invalid: \"%s\"",
                 (command->filename)._M_dataplus._M_p);
    }
  }
  if (local_e8.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_e8.store_,local_e8.root_index_);
    local_e8.obj_ = (Module *)0x0;
    local_e8.store_ = (Store *)0x0;
    local_e8.root_index_ = 0;
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_48);
  return (Result)EVar3;
}

Assistant:

wabt::Result CommandRunner::OnAssertUnlinkableCommand(
    const AssertUnlinkableCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);

  if (!module) {
    PrintError(command->line, "unable to compile unlinkable module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  if (!ValidIR(command->filename)) {
    PrintError(command->line, "IR Validator thinks module is invalid: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (!trap) {
    PrintError(command->line, "expected module to be unlinkable: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  // TODO: Change to one-line error.
  PrintError(command->line, "assert_unlinkable passed:\n  error: %s",
             trap->message().c_str());
  return wabt::Result::Ok;
}